

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::RecordStatementMap
          (FunctionBody *this,SmallSpanSequenceIter *iter,StatementData *data)

{
  code *pcVar1;
  bool bVar2;
  StatementMapList *pSVar3;
  undefined4 *puVar4;
  HeapAllocator *alloc;
  SmallSpanSequence *this_00;
  TrackAllocData local_48;
  StatementData *local_20;
  StatementData *data_local;
  SmallSpanSequenceIter *iter_local;
  FunctionBody *this_local;
  
  local_20 = data;
  data_local = (StatementData *)iter;
  iter_local = (SmallSpanSequenceIter *)this;
  pSVar3 = GetStatementMaps(this);
  if (pSVar3 != (StatementMapList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x123,"(!this->GetStatementMaps())","!this->GetStatementMaps()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->m_sourceInfo).pSpanSequence == (Type)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&SmallSpanSequence::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x127);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
    this_00 = (SmallSpanSequence *)new<Memory::HeapAllocator>(0x18,alloc,0x350bd0);
    SmallSpanSequence::SmallSpanSequence(this_00);
    (this->m_sourceInfo).pSpanSequence = this_00;
  }
  SmallSpanSequence::RecordARange
            ((this->m_sourceInfo).pSpanSequence,(SmallSpanSequenceIter *)data_local,local_20);
  return;
}

Assistant:

void
    FunctionBody::RecordStatementMap(SmallSpanSequenceIter &iter, StatementData * data)
    {
        Assert(!this->GetStatementMaps());

        if (!this->m_sourceInfo.pSpanSequence)
        {
            this->m_sourceInfo.pSpanSequence = HeapNew(SmallSpanSequence);
        }

        this->m_sourceInfo.pSpanSequence->RecordARange(iter, data);
    }